

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  color_quad<unsigned_char,_int> *p;
  level_details *plVar6;
  conversion_type conv_type;
  crn_comp_params *pcVar7;
  color_quad<unsigned_char,_int> *pcVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  pixel_buf_t *ppVar16;
  bool bVar17;
  bool bVar18;
  image_u8 cooked_image;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_80;
  image<crnlib::color_quad<unsigned_char,_int>_> local_78;
  long local_48;
  pixel_buf_t *local_40;
  crn_comp *local_38;
  
  bVar17 = this->m_pParams->m_faces == 0;
  if (!bVar17) {
    local_40 = &this->m_images[0][0].m_pixel_buf;
    local_48 = 0x30;
    local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0;
    local_38 = this;
    do {
      pcVar7 = this->m_pParams;
      bVar18 = pcVar7->m_levels != 0;
      if (bVar18) {
        pcVar8 = (color_quad<unsigned_char,_int> *)pcVar7->m_pImages[(long)local_80][0];
        if (pcVar8 != (color_quad<unsigned_char,_int> *)0x0) {
          uVar11 = pcVar7->m_height + (uint)(pcVar7->m_height == 0);
          uVar12 = pcVar7->m_width + (uint)(pcVar7->m_width == 0);
          uVar15 = 1;
          lVar9 = local_48;
          ppVar16 = local_40;
          do {
            if (ppVar16->m_p != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(ppVar16->m_p);
              ppVar16->m_p = (color_quad<unsigned_char,_int> *)0x0;
              ppVar16->m_size = 0;
              ppVar16->m_capacity = 0;
            }
            *(color_quad<unsigned_char,_int> **)((long)(ppVar16 + -1) + 8) = pcVar8;
            ((image_u8 *)(ppVar16 + -2))->m_width = uVar12;
            ((image_u8 *)(ppVar16 + -2))->m_height = uVar11;
            ((image_u8 *)(ppVar16 + -2))->m_pitch = uVar12;
            ((image_u8 *)(ppVar16 + -2))->m_total = uVar11 * uVar12;
            *(uint *)(ppVar16 + -1) = 0xf;
            pcVar7 = local_38->m_pParams;
            bVar18 = uVar15 < pcVar7->m_levels;
            this = local_38;
            if (!bVar18) goto LAB_0015f0c1;
            uVar13 = pcVar7->m_width >> ((byte)uVar15 & 0x1f);
            uVar12 = uVar13 + (uVar13 == 0);
            uVar13 = pcVar7->m_height >> ((byte)uVar15 & 0x1f);
            uVar11 = uVar13 + (uVar13 == 0);
            pcVar8 = *(color_quad<unsigned_char,_int> **)
                      ((long)(pcVar7->m_pImages + -1) + 0x58 + lVar9);
            ppVar16 = ppVar16 + 3;
            uVar15 = uVar15 + 1;
            lVar9 = lVar9 + 8;
          } while (pcVar8 != (color_quad<unsigned_char,_int> *)0x0);
        }
        this = local_38;
        if (bVar18) {
          if (bVar17 == false) {
            return false;
          }
          break;
        }
      }
LAB_0015f0c1:
      local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)((long)local_80 + 1);
      local_40 = local_40 + 0x30;
      local_48 = local_48 + 0x80;
      bVar18 = local_80 < (ulong)this->m_pParams->m_faces;
      bVar17 = !bVar18;
    } while (bVar18);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(this->m_pParams->m_format);
  if ((conv_type != cConversion_Invalid) && (this->m_pParams->m_faces != 0)) {
    local_80 = this->m_images[0];
    uVar10 = 0;
    do {
      if (this->m_pParams->m_levels != 0) {
        uVar14 = 0;
        other = local_80;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_78,other);
          image_utils::convert_image(&local_78,conv_type);
          uVar11 = other->m_width;
          other->m_width = local_78.m_width;
          uVar12 = other->m_height;
          other->m_height = local_78.m_height;
          uVar1 = other->m_pitch;
          other->m_pitch = local_78.m_pitch;
          uVar2 = other->m_total;
          other->m_total = local_78.m_total;
          uVar3 = other->m_comp_flags;
          other->m_comp_flags = local_78.m_comp_flags;
          pcVar8 = other->m_pPixels;
          other->m_pPixels = local_78.m_pPixels;
          p = (other->m_pixel_buf).m_p;
          (other->m_pixel_buf).m_p = local_78.m_pixel_buf.m_p;
          uVar4 = (other->m_pixel_buf).m_size;
          (other->m_pixel_buf).m_size = local_78.m_pixel_buf.m_size;
          uVar5 = (other->m_pixel_buf).m_capacity;
          (other->m_pixel_buf).m_capacity = local_78.m_pixel_buf.m_capacity;
          local_78.m_width = uVar11;
          local_78.m_height = uVar12;
          local_78.m_pitch = uVar1;
          local_78.m_total = uVar2;
          local_78.m_comp_flags = uVar3;
          local_78.m_pPixels = pcVar8;
          local_78.m_pixel_buf.m_p = p;
          local_78.m_pixel_buf.m_size = uVar4;
          local_78.m_pixel_buf.m_capacity = uVar5;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          uVar14 = uVar14 + 1;
          other = other + 1;
        } while (uVar14 < this->m_pParams->m_levels);
      }
      uVar10 = uVar10 + 1;
      local_80 = local_80 + 0x10;
    } while (uVar10 < this->m_pParams->m_faces);
  }
  uVar15 = this->m_pParams->m_levels;
  uVar13 = (this->m_levels).m_size;
  if (uVar13 != uVar15) {
    if ((uVar13 <= uVar15) && ((this->m_levels).m_capacity < uVar15)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_levels,uVar15,uVar13 + 1 == uVar15,0xc,
                 (object_mover)0x0,false);
    }
    (this->m_levels).m_size = uVar15;
  }
  this->m_total_blocks = 0;
  pcVar7 = this->m_pParams;
  if (pcVar7->m_levels != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      uVar15 = pcVar7->m_height >> ((byte)uVar10 & 0x1f);
      uVar13 = pcVar7->m_width >> ((byte)uVar10 & 0x1f);
      *(uint *)((long)&((this->m_levels).m_p)->block_width + lVar9) =
           (uVar13 + 7 + (uint)(uVar13 == 0) & 0xfffffff8) >> (2U - this->m_has_subblocks & 0x1f);
      *(uint *)((long)&((this->m_levels).m_p)->first_block + lVar9) = this->m_total_blocks;
      plVar6 = (this->m_levels).m_p;
      *(uint *)((long)&plVar6->num_blocks + lVar9) =
           (uVar15 + 7 + (uint)(uVar15 == 0) >> 2 & 0xfffffffe) * this->m_pParams->m_faces *
           *(int *)((long)&plVar6->block_width + lVar9);
      this->m_total_blocks =
           this->m_total_blocks + *(int *)((long)&((this->m_levels).m_p)->num_blocks + lVar9);
      uVar10 = uVar10 + 1;
      pcVar7 = this->m_pParams;
      lVar9 = lVar9 + 0xc;
    } while (uVar10 < pcVar7->m_levels);
  }
  return bVar17;
}

Assistant:

bool crn_comp::alias_images() {
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
      if (!m_pParams->m_pImages[face_index][level_index])
        return false;
      m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
    }
  }

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(m_images[face_index][level_index]);
        image_utils::convert_image(cooked_image, conv_type);
        m_images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  m_levels.resize(m_pParams->m_levels);
  m_total_blocks = 0;
  for (uint level = 0; level < m_pParams->m_levels; level++) {
    uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
    m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
    m_levels[level].first_block = m_total_blocks;
    m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
    m_total_blocks += m_levels[level].num_blocks;
  }

  return true;
}